

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O1

TrapezoidList * __thiscall
gepard::TrapezoidTessellator::trapezoidList_abi_cxx11_
          (TrapezoidList *__return_storage_ptr__,TrapezoidTessellator *this,GepardState *state)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  double dVar3;
  double dVar4;
  TrapezoidTessellator *pTVar5;
  bool bVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  Trapezoid *pTVar12;
  _List_node_base *p_Var13;
  FloatPoint *pFVar14;
  iterator __end2;
  ArcElement *ae;
  ArcElement *arcElement;
  FloatPoint *pFVar15;
  byte bVar16;
  FloatPoint FVar17;
  TrapezoidList trapezoids;
  FloatPoint to;
  FloatPoint from;
  FloatPoint lastMoveTo;
  SegmentApproximator segmentApproximator;
  Transform at;
  FloatPoint local_190;
  long local_180;
  FloatPoint local_178;
  TrapezoidTessellator *local_168;
  _List_node_base *local_160;
  FloatPoint local_158;
  FloatPoint local_148;
  _List_node_base *local_130;
  FloatPoint local_128;
  FloatPoint local_118;
  _List_node_base *local_108;
  double local_100;
  _List_node_base *local_f8;
  _List_node_base *local_f0;
  _List_node_base *local_e8;
  double local_e0;
  FloatPoint local_d8;
  SegmentApproximator local_c8;
  Transform local_68;
  
  bVar16 = 0;
  arcElement = (ArcElement *)this->_pathData->_firstElement;
  if ((arcElement == (ArcElement *)0x0) ||
     ((arcElement->super_PathElement).next == (PathElement *)0x0)) {
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node._M_size = 0;
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  }
  else {
    local_168 = this;
    if ((arcElement->super_PathElement).type != MoveTo) {
      __assert_fail("element->type == PathElementTypes::MoveTo",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                    ,0x283,
                    "const TrapezoidList gepard::TrapezoidTessellator::trapezoidList(const GepardState &)"
                   );
    }
    SegmentApproximator::SegmentApproximator(&local_c8,this->_antiAliasingLevel,1.0);
    FloatPoint::FloatPoint(&local_148);
    local_158.x = (arcElement->super_PathElement).to.x;
    local_158.y = (arcElement->super_PathElement).to.y;
    local_128.x = (arcElement->super_PathElement).to.x;
    local_128.y = (arcElement->super_PathElement).to.y;
    local_68.data[0] = (state->transform).data[0];
    local_68.data[1] = (state->transform).data[1];
    local_68.data[2] = (state->transform).data[2];
    local_68.data[3] = (state->transform).data[3];
    local_68.data[4] = (state->transform).data[4];
    local_68.data[5] = (state->transform).data[5];
    do {
      local_148.x = local_158.x;
      local_148.y = local_158.y;
      arcElement = (ArcElement *)(arcElement->super_PathElement).next;
      local_158.x = (arcElement->super_PathElement).to.x;
      local_158.y = (arcElement->super_PathElement).to.y;
      switch((arcElement->super_PathElement).type) {
      case MoveTo:
        FVar17 = Transform::apply(&local_68,&local_148);
        local_190.x = FVar17.x;
        local_190.y = FVar17.y;
        FVar17 = Transform::apply(&local_68,&local_128);
        local_178.x = FVar17.x;
        local_178.y = FVar17.y;
        SegmentApproximator::insertLine(&local_c8,&local_190,&local_178);
        goto LAB_00112905;
      case LineTo:
        FVar17 = Transform::apply(&local_68,&local_148);
        local_190.x = FVar17.x;
        local_190.y = FVar17.y;
        FVar17 = Transform::apply(&local_68,&local_158);
        local_178.x = FVar17.x;
        local_178.y = FVar17.y;
        SegmentApproximator::insertLine(&local_c8,&local_190,&local_178);
        break;
      case QuadraticCurve:
        FVar17 = Transform::apply(&local_68,&local_148);
        local_190.x = FVar17.x;
        local_190.y = FVar17.y;
        FVar17 = Transform::apply(&local_68,&arcElement->center);
        local_178.x = FVar17.x;
        local_178.y = FVar17.y;
        FVar17 = Transform::apply(&local_68,&local_158);
        local_118.x = FVar17.x;
        local_118.y = FVar17.y;
        SegmentApproximator::insertQuadCurve(&local_c8,&local_190,&local_178,&local_118);
        break;
      case BezierCurve:
        FVar17 = Transform::apply(&local_68,&local_148);
        local_190.x = FVar17.x;
        local_190.y = FVar17.y;
        FVar17 = Transform::apply(&local_68,&arcElement->center);
        local_178.x = FVar17.x;
        local_178.y = FVar17.y;
        FVar17 = Transform::apply(&local_68,&arcElement->radius);
        local_118.x = FVar17.x;
        local_118.y = FVar17.y;
        FVar17 = Transform::apply(&local_68,&local_158);
        local_d8.x = FVar17.x;
        local_d8.y = FVar17.y;
        SegmentApproximator::insertBezierCurve(&local_c8,&local_190,&local_178,&local_118,&local_d8)
        ;
        break;
      case Arc:
        FVar17 = Transform::apply(&local_68,&local_148);
        local_190.x = FVar17.x;
        local_190.y = FVar17.y;
        SegmentApproximator::insertArc(&local_c8,&local_190,arcElement,&local_68);
        break;
      case CloseSubpath:
        FVar17 = Transform::apply(&local_68,&local_148);
        local_190.x = FVar17.x;
        local_190.y = FVar17.y;
        FVar17 = Transform::apply(&local_68,&local_128);
        local_178.x = FVar17.x;
        local_178.y = FVar17.y;
        SegmentApproximator::insertLine(&local_c8,&local_190,&local_178);
LAB_00112905:
        local_128.x = local_158.x;
        local_128.y = local_158.y;
      }
    } while ((arcElement->super_PathElement).next != (PathElement *)0x0);
    FVar17 = Transform::apply(&local_68,&(arcElement->super_PathElement).to);
    local_190.x = FVar17.x;
    local_190.y = FVar17.y;
    FVar17 = Transform::apply(&local_68,&local_128);
    local_178.x = FVar17.x;
    local_178.y = FVar17.y;
    pFVar15 = &local_190;
    SegmentApproximator::insertLine(&local_c8,pFVar15,&local_178);
    p_Var7 = (_List_node_base *)SegmentApproximator::segments_abi_cxx11_(&local_c8);
    local_180 = 0;
    p_Var13 = p_Var7->_M_next;
    local_190.x = (Float)pFVar15;
    local_190.y = (Float)pFVar15;
    if (p_Var13 != p_Var7) {
      dVar3 = (double)local_168->_antiAliasingLevel;
      bVar6 = false;
      uVar11 = 0;
      do {
        p_Var2 = p_Var13[1]._M_prev;
        p_Var8 = p_Var13[2]._M_prev;
        if (((double)p_Var2 != (double)p_Var8) || (NAN((double)p_Var2) || NAN((double)p_Var8))) {
          uVar9 = uVar11 + *(int *)&p_Var13[4]._M_next;
          uVar11 = (uint)(uVar11 == 0);
          if (local_168->_fillRule != EvenOdd) {
            uVar11 = uVar9;
          }
          if (uVar11 == 0) {
            local_e0 = floor((double)p_Var13[1]._M_next * 1125899906842624.0);
            dVar4 = floor((double)p_Var13[2]._M_next * 1125899906842624.0);
            if (((double)local_130 != (double)local_160) ||
               (NAN((double)local_130) || NAN((double)local_160))) {
              p_Var2 = p_Var13[3]._M_next;
              local_108 = p_Var13[3]._M_prev;
              local_100 = dVar4;
              p_Var8 = (_List_node_base *)operator_new(0x58);
              p_Var8[1]._M_next = local_130;
              p_Var8[1]._M_prev = local_e8;
              p_Var8[2]._M_next = (_List_node_base *)((local_e0 * 8.881784197001252e-16) / dVar3);
              p_Var8[2]._M_prev = local_160;
              p_Var8[3]._M_next = local_f0;
              p_Var8[3]._M_prev = (_List_node_base *)((local_100 * 8.881784197001252e-16) / dVar3);
              *(int *)&p_Var8[4]._M_next = (int)pFVar15;
              *(int *)((long)&p_Var8[4]._M_next + 4) = (int)(long)(double)p_Var2;
              p_Var8[4]._M_prev = local_f8;
              p_Var8[5]._M_next = local_108;
              std::__detail::_List_node_base::_M_hook(p_Var8);
              local_180 = local_180 + 1;
            }
            bVar6 = false;
          }
          else if (!bVar6) {
            local_160 = p_Var8;
            dVar4 = floor((double)p_Var2);
            dVar4 = floor(((double)(int)dVar4 / dVar3) * 1125899906842624.0);
            local_130 = (_List_node_base *)(dVar4 * 8.881784197001252e-16);
            dVar4 = floor((double)local_160);
            dVar4 = floor(((double)(int)dVar4 / dVar3) * 1125899906842624.0);
            local_160 = (_List_node_base *)(dVar4 * 8.881784197001252e-16);
            dVar4 = floor((double)p_Var13[1]._M_next * 1125899906842624.0);
            local_e8 = (_List_node_base *)((dVar4 * 8.881784197001252e-16) / dVar3);
            dVar4 = floor((double)p_Var13[2]._M_next * 1125899906842624.0);
            pFVar15 = (FloatPoint *)(long)(double)p_Var13[3]._M_next;
            local_f0 = (_List_node_base *)((dVar4 * 8.881784197001252e-16) / dVar3);
            local_f8 = p_Var13[3]._M_prev;
            if (((double)local_130 != (double)local_160) ||
               (NAN((double)local_130) || NAN((double)local_160))) {
              bVar6 = true;
            }
          }
        }
        p_Var13 = (((_List_base<gepard::Segment,_std::allocator<gepard::Segment>_> *)
                   &p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var13 != p_Var7);
    }
    p_Var13 = p_Var7->_M_next;
    while (p_Var13 != p_Var7) {
      p_Var2 = p_Var13->_M_next;
      operator_delete(p_Var13);
      p_Var13 = p_Var2;
    }
    operator_delete(p_Var7);
    dVar3 = floor(local_c8._boundingBox.minX * 1125899906842624.0);
    pTVar5 = local_168;
    dVar4 = (double)local_168->_antiAliasingLevel;
    (local_168->_boundingBox).minX = (dVar3 * 8.881784197001252e-16) / dVar4;
    dVar3 = floor(local_c8._boundingBox.minY * 1125899906842624.0);
    (pTVar5->_boundingBox).minY = (dVar3 * 8.881784197001252e-16) / dVar4;
    dVar3 = floor(local_c8._boundingBox.maxX * 1125899906842624.0);
    (pTVar5->_boundingBox).maxX = (dVar3 * 8.881784197001252e-16) / dVar4;
    dVar3 = floor(local_c8._boundingBox.maxY * 1125899906842624.0);
    (pTVar5->_boundingBox).maxY = (dVar3 * 8.881784197001252e-16) / dVar4;
    std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::sort
              ((list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&local_190);
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node._M_size = 0;
    for (pFVar15 = (FloatPoint *)local_190.x; pFVar14 = (FloatPoint *)local_190.x,
        pFVar15 != &local_190; pFVar15 = (FloatPoint *)pFVar15->x) {
      if ((*(int *)&pFVar15[4].x == 0) || (*(int *)((long)&pFVar15[4].x + 4) == 0)) {
        __assert_fail("current->leftId != 0 && current->rightId != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                      ,0x2fa,
                      "const TrapezoidList gepard::TrapezoidTessellator::trapezoidList(const GepardState &)"
                     );
      }
      if (pFVar15 != &local_190) {
        local_168 = (TrapezoidTessellator *)pFVar15[2].y;
        pFVar14 = pFVar15;
        do {
          dVar3 = pFVar14[1].x;
          if ((double)local_168 < dVar3) break;
          if ((*(int *)&pFVar14[4].x == 0) || (*(int *)((long)&pFVar14[4].x + 4) == 0)) {
            __assert_fail("further->leftId != 0 && further->rightId != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                          ,0x2fd,
                          "const TrapezoidList gepard::TrapezoidTessellator::trapezoidList(const GepardState &)"
                         );
          }
          if (((dVar3 == pFVar15[2].y) && (!NAN(dVar3) && !NAN(pFVar15[2].y))) &&
             (bVar6 = Trapezoid::isMergableInTo
                                ((Trapezoid *)(pFVar15 + 1),(Trapezoid *)(pFVar14 + 1)), bVar6)) {
            pFVar14[1].x = pFVar15[1].x;
            pFVar14[1].y = pFVar15[1].y;
            pFVar14[2].x = pFVar15[2].x;
            pFVar15[4].x = 0.0;
            break;
          }
          pFVar14 = (FloatPoint *)pFVar14->x;
        } while (pFVar14 != &local_190);
      }
      if (*(int *)&pFVar15[4].x != 0) {
        p_Var7 = (_List_node_base *)operator_new(0x58);
        pTVar12 = (Trapezoid *)(pFVar15 + 1);
        p_Var13 = p_Var7 + 1;
        for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
          p_Var13->_M_next = (_List_node_base *)pTVar12->topY;
          pTVar12 = (Trapezoid *)((long)pTVar12 + (ulong)bVar16 * -0x10 + 8);
          p_Var13 = (_List_node_base *)&p_Var13[-(ulong)bVar16]._M_prev;
        }
        std::__detail::_List_node_base::_M_hook(p_Var7);
        psVar1 = &(__return_storage_ptr__->
                  super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>)._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
    }
    while (pFVar14 != &local_190) {
      pFVar15 = (FloatPoint *)pFVar14->x;
      operator_delete(pFVar14);
      pFVar14 = pFVar15;
    }
    SegmentApproximator::~SegmentApproximator(&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

const TrapezoidList TrapezoidTessellator::trapezoidList(const GepardState& state)
{
    PathElement* element = _pathData.firstElement();

    if (!element || !element->next)
        return TrapezoidList();

    GD_ASSERT(element->type == PathElementTypes::MoveTo);

    const Float subPixelPrecision = 1.0;
    SegmentApproximator segmentApproximator(_antiAliasingLevel, subPixelPrecision);
    FloatPoint from;
    FloatPoint to = element->to;
    FloatPoint lastMoveTo = to;
    Transform at = state.transform;

    // 1. Insert path elements.
    do {
        from = to;
        element = element->next;
        to = element->to;
        switch (element->type) {
        case PathElementTypes::MoveTo: {
            segmentApproximator.insertLine(at.apply(from), at.apply(lastMoveTo));
            lastMoveTo = to;
            break;
        }
        case PathElementTypes::LineTo: {
            segmentApproximator.insertLine(at.apply(from), at.apply(to));
            break;
        }
        case PathElementTypes::CloseSubpath: {
            segmentApproximator.insertLine(at.apply(from), at.apply(lastMoveTo));
            lastMoveTo = to;
            break;
        }
        case PathElementTypes::QuadraticCurve: {
            QuadraticCurveToElement* qe = reinterpret_cast<QuadraticCurveToElement*>(element);
            segmentApproximator.insertQuadCurve(at.apply(from), at.apply(qe->control), at.apply(to));
            break;
        }
        case PathElementTypes::BezierCurve: {
            BezierCurveToElement* be = reinterpret_cast<BezierCurveToElement*>(element);
            segmentApproximator.insertBezierCurve(at.apply(from), at.apply(be->control1), at.apply(be->control2), at.apply(to));
            break;
        }
        case PathElementTypes::Arc: {
            ArcElement* ae = reinterpret_cast<ArcElement*>(element);
            segmentApproximator.insertArc(at.apply(from), ae, at);
            break;
        }
        case PathElementTypes::Undefined:
        default:
            // unreachable
            break;
        }
    } while (element->next != nullptr);

    segmentApproximator.insertLine(at.apply(element->to), at.apply(lastMoveTo));

    // 2. Use approximator to generate the list of segments.
    SegmentList* segmentList = segmentApproximator.segments();
    TrapezoidList trapezoids;

    // 3. Generate trapezoids.
    const Float denom = _antiAliasingLevel * 1 + 0;
    if (segmentList) {
        Trapezoid trapezoid;
        int fill = 0;
        bool isInFill = false;
        for (Segment& segment : *segmentList) {
            if (segment.from.y == segment.to.y)
                continue;
            if (fillRule() == EvenOdd) {
                fill = !fill;
            } else {
                fill += segment.direction;
            }

            if (fill) {
                if (!isInFill) {
                    trapezoid.topY = (fixPrecision(segment.topY() / denom));
                    trapezoid.bottomY = (fixPrecision(segment.bottomY() / denom));
                    trapezoid.topLeftX = (fixPrecision(segment.from.x) / denom);
                    trapezoid.bottomLeftX = (fixPrecision(segment.to.x) / denom);
                    trapezoid.leftId = segment.id;
                    trapezoid.leftSlope = segment.realSlope;
                    if (trapezoid.topY != trapezoid.bottomY)
                        isInFill = true;
                }
            } else {
                // TODO: Horizontal merge trapezoids.
                trapezoid.topRightX = (fixPrecision(segment.from.x) / denom);
                trapezoid.bottomRightX = (fixPrecision(segment.to.x) / denom);
                trapezoid.rightId = segment.id;
                trapezoid.rightSlope = segment.realSlope;
                if (trapezoid.topY != trapezoid.bottomY) {
                    trapezoids.push_back(trapezoid);
                }
                isInFill = false;
            }
            //! \todo(szledan): we need this assert in the future,
            //! but the TT doesn't work correctly now with that.
            // GD_ASSERT(trapezoid.topY == (fixPrecision(segment.topY() / denom)));
        }

        delete segmentList;

        //! \todo(szledan): check the boundingBox calculation:
        // NOTE:  maxX = (maxX + (_antiAliasingLevel - 1)) / _antiAliasingLevel;
        _boundingBox.minX = (fixPrecision(segmentApproximator.boundingBox().minX) / _antiAliasingLevel);
        _boundingBox.minY = (fixPrecision(segmentApproximator.boundingBox().minY) / _antiAliasingLevel);
        _boundingBox.maxX = (fixPrecision(segmentApproximator.boundingBox().maxX) / _antiAliasingLevel);
        _boundingBox.maxY = (fixPrecision(segmentApproximator.boundingBox().maxY) / _antiAliasingLevel);
    }

    trapezoids.sort();

    // 4. Vertical merge trapezoids.
    //! \todo(szledan): use MovePtr:
    TrapezoidList trapezoidList;
    for (TrapezoidList::iterator current = trapezoids.begin(); current != trapezoids.end(); ++current) {
        const Float bottomY = current->bottomY;
        TrapezoidList::iterator ft = current;
        for (; (ft != trapezoids.end() && ft->bottomY == bottomY); ++ft);

        GD_ASSERT(current->leftId != 0 && current->rightId != 0);
        GD_ASSERT(current->leftSlope != NAN && current->rightSlope != NAN);
        for (TrapezoidList::iterator further = current; (further != trapezoids.end() && further->topY <= bottomY); ++further) {
            GD_ASSERT(further->leftId != 0 && further->rightId != 0);
            GD_ASSERT(further->leftSlope != NAN && further->rightSlope != NAN);
            if (further->topY == current->bottomY && current->isMergableInTo(&*further)) {
                further->topY = current->topY;
                further->topLeftX = current->topLeftX;
                further->topRightX = current->topRightX;
                current->leftId = 0;
                current->rightId = 0;
                break;
            }
        }
        if (current->leftId) {
            trapezoidList.push_back(*current);
        }
    }

    return trapezoidList;
}